

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

bool __thiscall QBuffer::seek(QBuffer *this,qint64 pos)

{
  bool bVar1;
  QBufferPrivate *pQVar2;
  qsizetype qVar3;
  QMessageLogger *pQVar4;
  QMessageLogger *in_RSI;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  bad_alloc *anon_var_0;
  qint64 MaxSeekPos;
  qsizetype oldBufSize;
  QBufferPrivate *d;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QMessageLogger *in_stack_ffffffffffffff60;
  bool local_49;
  QMessageLogger local_48;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QBuffer *)0x274085);
  qVar3 = QByteArray::size(pQVar2->buf);
  if ((qVar3 < (long)in_RSI) &&
     (bVar1 = QIODevice::isWritable((QIODevice *)in_stack_ffffffffffffff60), bVar1)) {
    QByteArray::resize((QByteArray *)in_stack_ffffffffffffff60,
                       CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                       (char)((uint)in_stack_ffffffffffffff54 >> 0x18));
    pQVar4 = (QMessageLogger *)QByteArray::size(pQVar2->buf);
    if (pQVar4 != in_RSI) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      QMessageLogger::warning(&local_28,"QBuffer::seek: Unable to fill gap");
      local_49 = false;
      goto LAB_002741fe;
    }
  }
  pQVar4 = in_RSI;
  qVar3 = QByteArray::size(pQVar2->buf);
  if ((qVar3 < (long)pQVar4) || ((long)in_RSI < 0)) {
    QMessageLogger::QMessageLogger
              (pQVar4,(char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
    QMessageLogger::warning(&local_48,"QBuffer::seek: Invalid pos: %lld",in_RSI);
    local_49 = false;
  }
  else {
    local_49 = QIODevice::seek(in_RDI,(qint64)pQVar4);
  }
LAB_002741fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QBuffer::seek(qint64 pos)
{
    Q_D(QBuffer);
    const auto oldBufSize = d->buf->size();
    constexpr qint64 MaxSeekPos = (std::numeric_limits<decltype(oldBufSize)>::max)();
    if (pos <= MaxSeekPos && pos > oldBufSize && isWritable()) {
        QT_TRY {
            d->buf->resize(qsizetype(pos), '\0');
        } QT_CATCH(const std::bad_alloc &) {} // swallow, failure case is handled below
        if (d->buf->size() != pos) {
            qWarning("QBuffer::seek: Unable to fill gap");
            return false;
        }
    }